

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void * kmpc_realloc(void *ptr,size_t size)

{
  int gtid;
  long in_RSI;
  long in_RDI;
  void *result;
  void *in_stack_00000018;
  kmp_info_t *in_stack_00000020;
  kmp_info_t *in_stack_00000028;
  bufsize in_stack_00000060;
  kmp_info_t *in_stack_00000068;
  int in_stack_00000084;
  char *in_stack_00000088;
  char *in_stack_00000090;
  undefined8 local_18;
  
  local_18 = (void *)0x0;
  if (in_RDI == 0) {
    __kmp_entry_thread();
    local_18 = bget(in_stack_00000068,in_stack_00000060);
    if (local_18 != (void *)0x0) {
      *(void **)local_18 = local_18;
      local_18 = (void *)((long)local_18 + 8);
    }
  }
  else if (in_RSI == 0) {
    if (*(long *)(in_RDI + -8) == 0) {
      __kmp_debug_assert(in_stack_00000090,in_stack_00000088,in_stack_00000084);
    }
    gtid = __kmp_get_global_thread_id();
    __kmp_thread_from_gtid(gtid);
    brel(in_stack_00000020,in_stack_00000018);
  }
  else {
    __kmp_entry_thread();
    local_18 = bgetr(in_stack_00000028,in_stack_00000020,(bufsize)in_stack_00000018);
    if (local_18 != (void *)0x0) {
      *(void **)local_18 = local_18;
      local_18 = (void *)((long)local_18 + 8);
    }
  }
  return local_18;
}

Assistant:

void *kmpc_realloc(void *ptr, size_t size) {
  void *result = NULL;
  if (ptr == NULL) {
    // If pointer is NULL, realloc behaves like malloc.
    result = bget(__kmp_entry_thread(), (bufsize)(size + sizeof(ptr)));
    // save allocated pointer just before one returned to user
    if (result != NULL) {
      *(void **)result = result;
      result = (void **)result + 1;
    }
  } else if (size == 0) {
    // If size is 0, realloc behaves like free.
    // The thread must be registered by the call to kmpc_malloc() or
    // kmpc_calloc() before.
    // So it should be safe to call __kmp_get_thread(), not
    // __kmp_entry_thread().
    KMP_ASSERT(*((void **)ptr - 1));
    brel(__kmp_get_thread(), *((void **)ptr - 1));
  } else {
    result = bgetr(__kmp_entry_thread(), *((void **)ptr - 1),
                   (bufsize)(size + sizeof(ptr)));
    if (result != NULL) {
      *(void **)result = result;
      result = (void **)result + 1;
    }
  }
  return result;
}